

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitLoad
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,Load *curr)

{
  Name memory;
  undefined1 this_00 [8];
  Address memorySize;
  Literal *pLVar1;
  Address addr;
  undefined1 local_d0 [8];
  Flow flow;
  undefined1 local_70 [8];
  Literal ret;
  undefined1 local_40 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_d0,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (flow.breakTo.super_IString.str._M_len == 0) {
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_40,this,(Name)(curr->memory).super_IString.str);
    memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)info.instance;
    memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_40,memory);
    this_00 = local_40;
    pLVar1 = Flow::getSingleValue((Flow *)local_d0);
    wasm::Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,pLVar1);
    addr = getFinalAddress<wasm::Load>
                     ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                      (Literal *)&flow.breakTo.super_IString.str._M_str,memorySize);
    wasm::Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
    if (curr->isAtomic == true) {
      checkAtomicAddress((ModuleRunnerBase<wasm::ModuleRunner> *)local_40,addr,(uint)curr->bytes,
                         memorySize);
    }
    (*(*(ExternalInterface **)((long)local_40 + 0x200))->_vptr_ExternalInterface[0xb])
              (local_70,*(ExternalInterface **)((long)local_40 + 0x200),curr,addr.addr,info.instance
               ,info.name.super_IString.str._M_len);
    wasm::Literal::Literal((Literal *)&ret.type,(Literal *)local_70);
    Flow::Flow(__return_storage_ptr__,(Literal *)&ret.type);
    wasm::Literal::~Literal((Literal *)&ret.type);
    wasm::Literal::~Literal((Literal *)local_70);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_d0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_d0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitLoad(Load* curr) {
    NOTE_ENTER("Load");
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, flow.getSingleValue(), memorySize);
    if (curr->isAtomic) {
      info.instance->checkAtomicAddress(addr, curr->bytes, memorySize);
    }
    auto ret = info.interface()->load(curr, addr, info.name);
    NOTE_EVAL1(addr);
    NOTE_EVAL1(ret);
    return ret;
  }